

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseSourceName(State *state)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t n;
  char *str;
  int length;
  ParseState copy;
  uint local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar5 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar5) {
    bVar3 = false;
    goto LAB_0010344a;
  }
  local_38._0_4_ = (state->parse_state).mangled_idx;
  local_38._4_4_ = (state->parse_state).out_cur_idx;
  uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  local_3c = 0xffffffff;
  bVar3 = ParseNumber(state,(int *)&local_3c);
  uVar2 = local_3c;
  iVar5 = state->recursion_depth;
  if (bVar3) {
    n = (size_t)(int)local_3c;
    state->recursion_depth = iVar5 + 1;
    iVar1 = state->steps;
    state->steps = iVar1 + 1;
    if (0x1ffff < iVar1 || 0xff < iVar5) goto LAB_00103439;
    str = state->mangled_begin + (state->parse_state).mangled_idx;
    bVar3 = AtLeastNumCharsRemaining(str,n);
    if (!bVar3) goto LAB_00103439;
    if (uVar2 < 0xc) {
LAB_0010345e:
      MaybeAppendWithLength(state,str,n);
    }
    else {
      lVar4 = 0;
      while( true ) {
        if ((str[lVar4] == '\0') || (str[lVar4] != "_GLOBAL__N_"[lVar4])) break;
        lVar4 = lVar4 + 1;
      }
      if ("_GLOBAL__N_"[lVar4] != '\0') goto LAB_0010345e;
      MaybeAppend(state,"(anonymous namespace)");
    }
    (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + uVar2;
    iVar5 = state->recursion_depth + -1;
    bVar3 = true;
  }
  else {
LAB_00103439:
    (state->parse_state).mangled_idx = (undefined4)local_38;
    (state->parse_state).out_cur_idx = local_38._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
    bVar3 = false;
  }
  iVar5 = iVar5 + -1;
LAB_0010344a:
  state->recursion_depth = iVar5;
  return bVar3;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) &&
      ParseIdentifier(state, static_cast<size_t>(length))) {
    return true;
  }
  state->parse_state = copy;
  return false;
}